

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

void __thiscall
llvm::DWARFDebugNames::ValueIterator::ValueIterator
          (ValueIterator *this,DWARFDebugNames *AccelTable,StringRef Key)

{
  undefined1 local_30 [8];
  StringRef Key_local;
  
  Key_local.Data = (char *)Key.Length;
  local_30 = (undefined1  [8])Key.Data;
  this->CurrentIndex =
       (NameIndex *)
       (AccelTable->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
       super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
       super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.super_SmallVectorBase
       .BeginX;
  this->IsLocal = false;
  (this->CurrentEntry).Storage.field_0.empty = '\0';
  (this->CurrentEntry).Storage.hasVal = false;
  this->DataOffset = 0;
  StringRef::str_abi_cxx11_(&this->Key,(StringRef *)local_30);
  (this->Hash).Storage.field_0.empty = '\0';
  (this->Hash).Storage.hasVal = false;
  searchFromStartOfCurrentIndex(this);
  return;
}

Assistant:

DWARFDebugNames::ValueIterator::ValueIterator(const DWARFDebugNames &AccelTable,
                                              StringRef Key)
    : CurrentIndex(AccelTable.NameIndices.begin()), IsLocal(false), Key(Key) {
  searchFromStartOfCurrentIndex();
}